

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O2

void FlatZinc::anon_unknown_4::p_int_CMP_reif(IntRelType irt,ConExpr *ce,Node *ann)

{
  pointer ppNVar1;
  bool bVar2;
  int c;
  IntVar *x;
  IntVar *y;
  Node *extraout_RDX;
  Node *extraout_RDX_00;
  Node *pNVar3;
  BoolView *r;
  BoolView BStack_58;
  BoolView local_48;
  BoolView local_38;
  
  r = &BStack_58;
  bVar2 = AST::Node::isBool((ce->args->a).
                            super__Vector_base<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[2]);
  ppNVar1 = (ce->args->a).
            super__Vector_base<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (bVar2) {
    bVar2 = AST::Node::getBool(ppNVar1[2]);
    pNVar3 = extraout_RDX;
    if (!bVar2) {
      irt = operator!(irt);
      pNVar3 = extraout_RDX_00;
    }
    p_int_CMP(irt,ce,pNVar3);
    return;
  }
  bVar2 = AST::Node::isIntVar(*ppNVar1);
  pNVar3 = (ce->args->a).
           super__Vector_base<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>._M_impl
           .super__Vector_impl_data._M_start[1];
  if (bVar2) {
    bVar2 = AST::Node::isIntVar(pNVar3);
    x = getIntVar(*(ce->args->a).
                   super__Vector_base<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    pNVar3 = (ce->args->a).
             super__Vector_base<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>.
             _M_impl.super__Vector_impl_data._M_start[1];
    if (bVar2) {
      y = getIntVar(pNVar3);
      getBoolVar((anon_unknown_4 *)&local_38,
                 (ce->args->a).
                 super__Vector_base<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[2]);
      int_rel_reif(x,irt,y,&local_38,0);
      return;
    }
    c = AST::Node::getInt(pNVar3);
    pNVar3 = (ce->args->a).
             super__Vector_base<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>.
             _M_impl.super__Vector_impl_data._M_start[2];
    r = &local_48;
  }
  else {
    x = getIntVar(pNVar3);
    irt = operator-(irt);
    c = AST::Node::getInt(*(ce->args->a).
                           super__Vector_base<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>
                           ._M_impl.super__Vector_impl_data._M_start);
    pNVar3 = (ce->args->a).
             super__Vector_base<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>.
             _M_impl.super__Vector_impl_data._M_start[2];
  }
  getBoolVar((anon_unknown_4 *)r,pNVar3);
  int_rel_reif(x,irt,c,r);
  return;
}

Assistant:

void p_int_CMP_reif(IntRelType irt, const ConExpr& ce, AST::Node* ann) {
	if (ce[2]->isBool()) {
		if (ce[2]->getBool()) {
			p_int_CMP(irt, ce, ann);
		} else {
			p_int_CMP(!irt, ce, ann);
		}
		return;
	}
	if (ce[0]->isIntVar()) {
		if (ce[1]->isIntVar()) {
			int_rel_reif(getIntVar(ce[0]), irt, getIntVar(ce[1]), getBoolVar(ce[2]));
		} else {
			int_rel_reif(getIntVar(ce[0]), irt, ce[1]->getInt(), getBoolVar(ce[2]));
		}
	} else {
		int_rel_reif(getIntVar(ce[1]), -irt, ce[0]->getInt(), getBoolVar(ce[2]));
	}
}